

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O2

void __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData
          (_ItemSimilarityRecommenderData *this,ItemSimilarityRecommender *isr)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  Int64Vector *pIVar3;
  Rep *pRVar4;
  uint64_t uVar5;
  StringVector *pSVar6;
  Rep *pRVar7;
  int iVar8;
  Type *pTVar9;
  vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>> *this_00;
  Type *pTVar10;
  mapped_type_conflict *pmVar11;
  invalid_argument *piVar12;
  int index;
  pointer __val;
  pointer pcVar13;
  long *__last;
  long *__first;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first_00;
  int j;
  int index_00;
  int iVar14;
  uint64_t item_id;
  undefined1 local_e8 [40];
  uint64_t local_c0;
  RepeatedPtrFieldBase *local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(this->item_interactions)._M_t._M_impl.super__Rb_tree_header;
  (this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->item_shift_values)._M_t._M_impl.super__Rb_tree_header;
  (this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->item_restriction_input_column)._M_dataplus._M_p =
       (pointer)&(this->item_restriction_input_column).field_2;
  (this->item_restriction_input_column)._M_string_length = 0;
  __val = (pointer)0x0;
  (this->item_restriction_input_column).field_2._M_local_buf[0] = '\0';
  (this->num_recommendations_input_column)._M_dataplus._M_p =
       (pointer)&(this->num_recommendations_input_column).field_2;
  (this->num_recommendations_input_column)._M_string_length = 0;
  (this->num_recommendations_input_column).field_2._M_local_buf[0] = '\0';
  (this->item_exclusion_input_column)._M_dataplus._M_p =
       (pointer)&(this->item_exclusion_input_column).field_2;
  (this->item_exclusion_input_column)._M_string_length = 0;
  (this->item_exclusion_input_column).field_2._M_local_buf[0] = '\0';
  (this->item_data_input_column)._M_dataplus._M_p = (pointer)&(this->item_data_input_column).field_2
  ;
  (this->item_data_input_column)._M_string_length = 0;
  (this->item_data_input_column).field_2._M_local_buf[0] = '\0';
  (this->item_list_output_column)._M_dataplus._M_p =
       (pointer)&(this->item_list_output_column).field_2;
  (this->item_list_output_column)._M_string_length = 0;
  (this->item_list_output_column).field_2._M_local_buf[0] = '\0';
  (this->item_score_output_column)._M_dataplus._M_p =
       (pointer)&(this->item_score_output_column).field_2;
  (this->item_score_output_column)._M_string_length = 0;
  (this->item_score_output_column).field_2._M_local_buf[0] = '\0';
  (this->string_id_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->string_id_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->string_id_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = (isr->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  local_b8 = &(isr->itemitemsimilarities_).super_RepeatedPtrFieldBase;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  for (index = 0; index != iVar8; index = index + 1) {
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
                       (local_b8,index);
    pcVar13 = (pointer)pTVar9->itemid_;
    item_id = (uint64_t)pcVar13;
    this_00 = (vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
               *)std::
                 map<unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                 ::operator[](&this->item_interactions,&item_id);
    if (__val <= pcVar13) {
      __val = pcVar13;
    }
    iVar14 = (pTVar9->similaritemlist_).super_RepeatedPtrFieldBase.current_size_;
    index_00 = 0;
    if (iVar14 < 1) {
      iVar14 = index_00;
    }
    for (; iVar14 != index_00; index_00 = index_00 + 1) {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
                          (&(pTVar9->similaritemlist_).super_RepeatedPtrFieldBase,index_00);
      pcVar13 = (pointer)pTVar10->itemid_;
      local_e8._8_8_ = pTVar10->similarityscore_;
      local_e8._0_8_ = pcVar13;
      std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
      emplace_back<std::pair<unsigned_long,double>>(this_00,(pair<unsigned_long,_double> *)local_e8)
      ;
      if (__val <= pcVar13) {
        __val = pcVar13;
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8));
    dVar2 = pTVar9->itemscoreadjustment_;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      pmVar11 = std::
                map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                ::operator[](&this->item_shift_values,&item_id);
      *pmVar11 = dVar2;
    }
  }
  this->num_items = 0;
  pIVar3 = isr->itemint64ids_;
  if ((pIVar3 == (Int64Vector *)0x0 ||
       isr == (ItemSimilarityRecommender *)
              &Specification::_ItemSimilarityRecommender_default_instance_) ||
     (pcVar13 = (pointer)(long)(pIVar3->vector_).current_size_, pcVar13 == (pointer)0x0)) {
    pSVar6 = isr->itemstringids_;
    if ((pSVar6 == (StringVector *)0x0 ||
         isr == (ItemSimilarityRecommender *)
                &Specification::_ItemSimilarityRecommender_default_instance_) ||
       (pcVar13 = (pointer)(long)(pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_,
       pcVar13 == (pointer)0x0)) {
      this->num_items = (uint64_t)(__val + 1);
    }
    else {
      this->num_items = (uint64_t)pcVar13;
      if (pcVar13 < __val) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_90,(unsigned_long)__val);
        std::operator+(&local_70,
                       "List of string item ids specified must be large enough to index all item ids specified.  The largest item index is "
                       ,&local_90);
        std::operator+(&local_50,&local_70,", whereas there are  only ");
        std::__cxx11::to_string(&local_b0,this->num_items);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item_id
                       ,&local_50,&local_b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &item_id," item ids given.");
        std::invalid_argument::invalid_argument(piVar12,(string *)local_e8);
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&this->string_id_values,(size_type)pcVar13);
      pRVar7 = (pSVar6->vector_).super_RepeatedPtrFieldBase.rep_;
      __first_00.it_ = pRVar7->elements;
      if (pRVar7 == (Rep *)0x0) {
        __first_00.it_ = (void **)0x0;
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (__first_00,
                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first_00.it_ + (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_),
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&this->string_id_values);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_e8,
                 (this->string_id_values).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->string_id_values).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      uVar5 = this->num_items;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e8);
      if (local_c0 != uVar5) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar12,
                   "List of string item ids specified must be unique; list contains duplicates.");
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
  }
  else {
    if ((isr->itemstringids_ != (StringVector *)0x0) &&
       ((isr->itemstringids_->vector_).super_RepeatedPtrFieldBase.current_size_ != 0)) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar12,
                 "Only integer item ids or string item ids can be specified in the same model.");
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this->num_items = (uint64_t)pcVar13;
    if (pcVar13 <= __val) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_90,(unsigned_long)__val);
      std::operator+(&local_70,
                     "List of integer item ids specified must be large enough to index all item ids specified.  The largest item index is "
                     ,&local_90);
      std::operator+(&local_50,&local_70,", whereas there are  only ");
      std::__cxx11::to_string(&local_b0,this->num_items);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item_id,
                     &local_50,&local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item_id,
                     " item ids given.");
      std::invalid_argument::invalid_argument(piVar12,(string *)local_e8);
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::vector<long,_std::allocator<long>_>::reserve(&this->integer_id_values,(size_type)pcVar13);
    pRVar4 = (pIVar3->vector_).rep_;
    __first = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      __first = (long *)0x0;
    }
    __last = pRVar4->elements + (pIVar3->vector_).current_size_;
    if (pRVar4 == (Rep *)0x0) {
      __last = (long *)0x0;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<long_const*,std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
              (__first,__last,
               (back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)
               &this->integer_id_values);
    std::set<long,std::less<long>,std::allocator<long>>::
    set<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              ((set<long,std::less<long>,std::allocator<long>> *)local_e8,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    uVar5 = this->num_items;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
              local_e8);
    if (local_c0 != uVar5) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar12,
                 "List of integer item ids specified must be unique; list contains duplicates.");
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->item_data_input_column);
  std::__cxx11::string::_M_assign((string *)&this->num_recommendations_input_column);
  std::__cxx11::string::_M_assign((string *)&this->item_exclusion_input_column);
  std::__cxx11::string::_M_assign((string *)&this->item_restriction_input_column);
  std::__cxx11::string::_M_assign((string *)&this->item_list_output_column);
  std::__cxx11::string::_M_assign((string *)&this->item_score_output_column);
  return;
}

Assistant:

_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData(const Specification::ItemSimilarityRecommender& isr) {

    uint64_t max_item = 0;
    int n_similarities = isr.itemitemsimilarities_size();

    for(int i = 0; i < n_similarities; ++i) {
      const auto& item_sim_info = isr.itemitemsimilarities(i);
      uint64_t item_id = item_sim_info.itemid();
      max_item = std::max(max_item, item_id);

      auto& interaction_list_dest = item_interactions[item_id];
      int n_interactions = item_sim_info.similaritemlist_size();

      for(int j = 0; j < n_interactions; ++j) {
        const auto& interaction = item_sim_info.similaritemlist(j);
        uint64_t inter_id = interaction.itemid();
        double score = interaction.similarityscore();

        interaction_list_dest.push_back({inter_id, score});

        max_item = std::max(max_item, inter_id);
      }

      // Sort to ensure equality between equivalent models.
      std::sort(interaction_list_dest.begin(), interaction_list_dest.end());
      double score_shift = item_sim_info.itemscoreadjustment();
      if(score_shift != 0) {
        item_shift_values[item_id] = score_shift;
      }
    }

    num_items = 0;

    // Check out the item similarity
    if(isr.has_itemint64ids() && isr.itemint64ids().vector_size() != 0) {
      if(isr.has_itemstringids() && isr.itemstringids().vector_size() != 0) {
        throw std::invalid_argument("Only integer item ids or string item ids can be specified in the same model.");
      }
      
      num_items = uint64_t(isr.itemint64ids().vector_size());

      if(num_items <= max_item) {
        throw std::invalid_argument("List of integer item ids specified must be "
                                    "large enough to index all item ids specified.  The largest item "
                                    "index is " + std::to_string(max_item) + ", whereas there are "
                                    " only " + std::to_string(num_items) + " item ids given.");
      }


      const auto& itemint64idsVector = isr.itemint64ids().vector();
      integer_id_values.reserve(static_cast<size_t>(num_items));
      std::copy(itemint64idsVector.begin(), itemint64idsVector.end(), std::back_inserter(integer_id_values));

      if(std::set<int64_t>(integer_id_values.begin(), integer_id_values.end()).size() != num_items) {
        throw std::invalid_argument("List of integer item ids specified must be "
                                    "unique; list contains duplicates.");
      }

    } else if(isr.has_itemstringids() && isr.itemstringids().vector_size() != 0) {
      
      num_items = size_t(isr.itemstringids().vector_size());

      if(size_t(isr.itemstringids().vector_size()) < max_item) {
        throw std::invalid_argument("List of string item ids specified must be "
                                    "large enough to index all item ids specified.  The largest item "
                                    "index is " + std::to_string(max_item) + ", whereas there are "
                                    " only " + std::to_string(num_items) + " item ids given.");
      }

      const auto& itemstringidsVector = isr.itemstringids().vector();
      string_id_values.reserve(static_cast<size_t>(num_items));
      std::copy(itemstringidsVector.begin(), itemstringidsVector.end(), std::back_inserter(string_id_values));

      if(std::set<std::string>(string_id_values.begin(), string_id_values.end()).size() != num_items) {
        throw std::invalid_argument("List of string item ids specified must be "
                                    "unique; list contains duplicates.");
      }
    } else {
      num_items = max_item + 1;
    }

    // Check out the specific parameters
    item_data_input_column = isr.iteminputfeaturename();
    num_recommendations_input_column = isr.numrecommendationsinputfeaturename();
    item_exclusion_input_column = isr.itemexclusioninputfeaturename();
    item_restriction_input_column = isr.itemrestrictioninputfeaturename();

    // Get the item output columns.
    item_list_output_column = isr.recommendeditemlistoutputfeaturename();
    item_score_output_column = isr.recommendeditemscoreoutputfeaturename();
  }